

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O1

void __thiscall timing_registry::dump(timing_registry *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ptVar1;
  pointer ptVar2;
  int iVar3;
  undefined8 uVar4;
  _Hash_node_base *p_Var5;
  pointer ptVar6;
  vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> infos;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> childrenToDelete;
  vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> local_68;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> local_48;
  task_info *local_28;
  
  local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    if (local_68.
        super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector(&local_48);
    _Unwind_Resume(uVar4);
  }
  local_68.
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = (this->tasks)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      if (p_Var5[0xf]._M_nxt == (_Hash_node_base *)0x0) {
        local_28 = (task_info *)(p_Var5 + 2);
        std::vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>>::
        emplace_back<timing_registry::task_info*>
                  ((vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>>
                    *)&local_68,&local_28);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  print(this,&local_68,0,&local_48);
  if (local_68.
      super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  ptVar2 = local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ptVar1 = local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ptVar6 = local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      this_00 = (ptVar6->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != ptVar2);
    local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar1;
  }
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector(&local_48);
  return;
}

Assistant:

void dump()
    {
        std::vector<oqpi::task_handle> childrenToDelete;
        {
            std::lock_guard<std::recursive_mutex> __l(m);
            std::vector<task_info*> infos;
            for (auto &p : tasks)
            {
                if (p.second.parentUID == oqpi::invalid_task_uid)
                    infos.push_back(&p.second);
            }
            print(infos, 0, childrenToDelete);
        }
        childrenToDelete.clear();
    }